

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O1

void __thiscall cursespp::TextInput::TextInput(TextInput *this,Style style,InputMode inputMode)

{
  connections_list *pcVar1;
  connections_list *pcVar2;
  
  Window::Window(&this->super_Window,(IWindow *)0x0);
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__TextInput_001aa928;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__TextInput_001aab38;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__TextInput_001aab68;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__TextInput_001aab90;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__TextInput_001aabb8;
  (this->super_IInput)._vptr_IInput = (_func_int **)&PTR__TextInput_001aabe0;
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->EnterPressed).
                      super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
                      super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar1 = &(this->EnterPressed).
            super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
            m_connected_slots;
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pcVar1;
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar1;
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  m_connected_slots.
  super__List_base<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->EnterPressed).super__signal_base1<cursespp::TextInput_*,_sigslot::multi_threaded_local>.
  super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal1_001aaca8;
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_init((pthread_mutex_t *)
                     &(this->TextChanged).
                      super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                      .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
                      m_mutex,(pthread_mutexattr_t *)0x0);
  pcVar2 = &(this->TextChanged).
            super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
            .m_connected_slots;
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pcVar2;
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pcVar2;
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .m_connected_slots.
  super__List_base<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->TextChanged).
  super__signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001aad58;
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rawBlacklist).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->buffer)._M_dataplus._M_p = (pointer)&(this->buffer).field_2;
  (this->buffer)._M_string_length = 0;
  (this->buffer).field_2._M_local_buf[0] = '\0';
  (this->hintText)._M_dataplus._M_p = (pointer)&(this->hintText).field_2;
  (this->hintText)._M_string_length = 0;
  (this->hintText).field_2._M_local_buf[0] = '\0';
  this->position = 0;
  this->enterEnabled = true;
  this->truncate = false;
  this->bufferLength = 0;
  this->style = style;
  this->inputMode = inputMode;
  if (style == StyleLine) {
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x11])(this,0);
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0xc])(this);
  }
  return;
}

Assistant:

TextInput::TextInput(TextInput::Style style, IInput::InputMode inputMode)
: Window()
, bufferLength(0)
, position(0)
, style(style)
, inputMode(inputMode)
, enterEnabled(true)
, truncate(false) {
    if (style == StyleLine) {
        this->SetFrameVisible(false);
        this->SetFocusedContentColor(Color::TextFocused);
    }
}